

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void HuffmanTree_cleanup(HuffmanTree *tree)

{
  free(tree->tree2d);
  free(tree->tree1d);
  free(tree->lengths);
  return;
}

Assistant:

static void HuffmanTree_cleanup(HuffmanTree* tree)
{
  lodepng_free(tree->tree2d);
  lodepng_free(tree->tree1d);
  lodepng_free(tree->lengths);
}